

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void mean_double_suite::test_same(void)

{
  undefined8 local_68;
  value_type local_60 [2];
  undefined8 local_50;
  value_type local_48 [2];
  undefined8 local_38;
  value_type local_30 [2];
  undefined1 local_20 [8];
  moment<double> filter;
  
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::basic_moment
            ((basic_moment<double,_(trial::online::with)1> *)local_20,0.125);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_20,1.0);
  local_30[0] = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                          ((basic_moment<double,_(trial::online::with)1> *)local_20);
  local_38 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x2d,"void mean_double_suite::test_same()",local_30,&local_38);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_20,1.0);
  local_48[0] = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                          ((basic_moment<double,_(trial::online::with)1> *)local_20);
  local_50 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x2f,"void mean_double_suite::test_same()",local_48,&local_50);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_20,1.0);
  local_60[0] = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                          ((basic_moment<double,_(trial::online::with)1> *)local_20);
  local_68 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x31,"void mean_double_suite::test_same()",local_60,&local_68);
  return;
}

Assistant:

void test_same()
{
    decay::moment<double> filter(one_over_eight);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
}